

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tensor.cc
# Opt level: O2

vector<float,_std::allocator<float>_> *
cnn::as_vector(vector<float,_std::allocator<float>_> *__return_storage_ptr__,Tensor *v)

{
  pointer __dest;
  uint uVar1;
  allocator_type local_11;
  
  uVar1 = Dim::size(&v->d);
  std::vector<float,_std::allocator<float>_>::vector(__return_storage_ptr__,(ulong)uVar1,&local_11);
  __dest = (__return_storage_ptr__->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
           super__Vector_impl_data._M_start;
  memcpy(__dest,v->v,
         (long)(__return_storage_ptr__->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
               super__Vector_impl_data._M_finish - (long)__dest);
  return __return_storage_ptr__;
}

Assistant:

vector<real> as_vector(const Tensor& v) {
  vector<real> res(v.d.size());
#if HAVE_CUDA
  CUDA_CHECK(cudaMemcpy(&res[0], v.v, sizeof(real) * res.size(), cudaMemcpyDeviceToHost));
#else
  memcpy(&res[0], v.v, sizeof(real) * res.size());
#endif
  return res;
}